

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O1

cmExternalMakefileProjectGenerator * __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeLiteGenerator>::
CreateExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeLiteGenerator> *this)

{
  cmExtraCodeLiteGenerator *this_00;
  string local_38;
  
  this_00 = (cmExtraCodeLiteGenerator *)operator_new(0x90);
  cmExtraCodeLiteGenerator::cmExtraCodeLiteGenerator(this_00);
  cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_
            (&local_38,&this->super_cmExternalMakefileProjectGeneratorFactory);
  std::__cxx11::string::_M_assign
            ((string *)&(this_00->super_cmExternalMakefileProjectGenerator).Name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return &this_00->super_cmExternalMakefileProjectGenerator;
}

Assistant:

cmExternalMakefileProjectGenerator* CreateExternalMakefileProjectGenerator()
    const CM_OVERRIDE
  {
    T* p = new T;
    p->SetName(GetName());
    return p;
  }